

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

Am_Object GV_undo_handler_from_cmd(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *in_RSI;
  Am_Object window;
  Am_Object widget;
  Am_Value v;
  Am_Object undo_handler;
  Am_Object local_48;
  Am_Object local_40;
  Am_Value local_38;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  local_40.data = (Am_Object_Data *)0x0;
  local_48.data = (Am_Object_Data *)0x0;
  local_18.data = (Am_Object_Data *)0x0;
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_28,in_RSI);
  Am_Get_Selection_Widget_For_Command(&local_20);
  Am_Object::operator=(&local_40,&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Object::Valid(&local_40);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_40,0x68,0);
    Am_Object::operator=(&local_48,pAVar2);
  }
  bVar1 = Am_Object::Valid(&local_48);
  if (!bVar1) {
    pAVar2 = Am_Object::Get(in_RSI,0x170,1);
    Am_Value::operator=(&local_38,pAVar2);
    bVar1 = Am_Value::Valid(&local_38);
    if (bVar1) {
      Am_Object::operator=(&local_40,&local_38);
      pAVar2 = Am_Object::Get(&local_40,0x68,0);
      Am_Object::operator=(&local_48,pAVar2);
    }
  }
  bVar1 = Am_Object::Valid(&local_48);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_48,0x174,1);
    Am_Value::operator=(&local_38,pAVar2);
    bVar1 = Am_Value::Valid(&local_38);
    if (bVar1) {
      Am_Object::Am_Object(cmd,&local_38);
      goto LAB_0023fdda;
    }
  }
  Am_Object::Am_Object(cmd,&Am_No_Object);
LAB_0023fdda:
  Am_Value::~Am_Value(&local_38);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
GV_undo_handler_from_cmd(Am_Object cmd)
{
  Am_Object widget, window, undo_handler;
  Am_Value v;
  widget = Am_Get_Selection_Widget_For_Command(cmd);
  if (widget.Valid()) {
    window = widget.Get(Am_WINDOW);
  }
  if (!window.Valid()) {
    v = cmd.Peek(Am_SAVED_OLD_OWNER);
    if (v.Valid()) {
      widget = v;
      window = widget.Get(Am_WINDOW);
    }
  }
  if (window.Valid()) {
    v = window.Peek(Am_UNDO_HANDLER);
    if (v.Valid())
      return v;
  }
  return Am_No_Object;
}